

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSuite.cpp
# Opt level: O1

vector<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>
* __thiscall
Test::Suite::filterTests
          (vector<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>
           *__return_storage_ptr__,Suite *this,
          vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_> *selectedMethods)

{
  pointer *pprVar1;
  pointer pTVar2;
  iterator __position;
  TestMethodInfo *info;
  pointer pTVar3;
  reference_wrapper<const_Test::Suite::TestMethod> local_28;
  
  (__return_storage_ptr__->
  super__Vector_base<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>
  ::reserve(__return_storage_ptr__,
            ((long)(selectedMethods->
                   super__Vector_base<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(selectedMethods->
                   super__Vector_base<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333);
  pTVar2 = (selectedMethods->
           super__Vector_base<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pTVar3 = (selectedMethods->
                super__Vector_base<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>).
                _M_impl.super__Vector_impl_data._M_start; pTVar3 != pTVar2; pTVar3 = pTVar3 + 1) {
    local_28._M_data = (TestMethod *)pTVar3->reference;
    __position._M_current =
         (__return_storage_ptr__->
         super__Vector_base<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<std::reference_wrapper<Test::Suite::TestMethod_const>,std::allocator<std::reference_wrapper<Test::Suite::TestMethod_const>>>
      ::_M_realloc_insert<std::reference_wrapper<Test::Suite::TestMethod_const>>
                ((vector<std::reference_wrapper<Test::Suite::TestMethod_const>,std::allocator<std::reference_wrapper<Test::Suite::TestMethod_const>>>
                  *)__return_storage_ptr__,__position,&local_28);
    }
    else {
      (__position._M_current)->_M_data = local_28._M_data;
      pprVar1 = &(__return_storage_ptr__->
                 super__Vector_base<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *pprVar1 = *pprVar1 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::reference_wrapper<const Suite::TestMethod>> Suite::filterTests(
    const std::vector<TestMethodInfo> &selectedMethods) {
  std::vector<std::reference_wrapper<const TestMethod>> result;
  result.reserve(selectedMethods.size());

  for (const auto &info : selectedMethods) {
    const auto *method = reinterpret_cast<const TestMethod *>(info.reference);
    result.emplace_back(std::cref(*method));
  }

  return result;
}